

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * ot::commissioner::TokenManager::PrepareSigningContent
                  (Error *__return_storage_ptr__,ByteArray *aContent,Message *aMessage)

{
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  *this;
  Type aType;
  Code aCode;
  bool bVar1;
  Error *pEVar2;
  size_t __n;
  ByteArray *aBuf;
  reference ppVar3;
  element_type *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_> *tlv;
  iterator __end2;
  iterator __begin2;
  TlvSet *__range2;
  Error local_318;
  uchar *local_2f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e0;
  const_iterator local_2d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d0;
  const_iterator local_2c8;
  ErrorCode local_2bc;
  Error local_2b8;
  ErrorCode local_28c;
  Error local_288;
  anon_class_1_0_00000001 local_25a;
  v10 local_259;
  v10 *local_258;
  size_t local_250;
  string local_248;
  Error local_228;
  ErrorCode local_1fc;
  Error local_1f8;
  undefined1 local_1d0 [8];
  ByteArray content;
  undefined1 local_1b0 [6];
  bool isPendingSet;
  bool isActiveSet;
  string signingUri;
  TlvSet tlvSet;
  undefined1 local_150 [8];
  Message message;
  Message *aMessage_local;
  ByteArray *aContent_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  message.mEndpoint._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  aType = coap::Message::GetType(aMessage);
  aCode = coap::Message::GetCode(aMessage);
  coap::Message::Message((Message *)local_150,aType,aCode);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)((long)&signingUri.field_2 + 8));
  std::__cxx11::string::string((string *)local_1b0);
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  coap::Message::GetUriPath(&local_1f8,aMessage,(string *)local_1b0);
  local_1fc = kNone;
  bVar1 = commissioner::operator==(&local_1f8,&local_1fc);
  Error::~Error(&local_1f8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,"/c/as");
    content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,"/c/ps");
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"/c/cp");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_1b0,"/c/lp");
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b0,"/c/ca");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_1b0,"/c/la");
      }
    }
    coap::Message::SetUriPath(&local_288,(Message *)local_150,(string *)local_1b0);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_288);
    local_28c = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_28c);
    Error::~Error(&local_288);
    if (!bVar1) {
      coap::Message::Serialize(&local_2b8,(Message *)local_150,(ByteArray *)local_1d0);
      pEVar2 = Error::operator=(__return_storage_ptr__,&local_2b8);
      local_2bc = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_2bc);
      Error::~Error(&local_2b8);
      if (!bVar1) {
        local_2d0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_2c8,&local_2d0);
        local_2e8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0)
        ;
        __n = coap::Message::GetHeaderLength((Message *)local_150);
        local_2e0 = __gnu_cxx::
                    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_2e8,__n);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_2d8,&local_2e0);
        local_2f0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        local_1d0,local_2c8,local_2d8);
        aBuf = coap::Message::GetPayload(aMessage);
        commissioner::tlv::GetTlvSet
                  (&local_318,(TlvSet *)((long)&signingUri.field_2 + 8),aBuf,kMeshCoP);
        pEVar2 = Error::operator=(__return_storage_ptr__,&local_318);
        __range2._4_4_ = 0;
        bVar1 = commissioner::operator!=(pEVar2,(ErrorCode *)((long)&__range2 + 4));
        Error::~Error(&local_318);
        if (!bVar1) {
          this = (map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                  *)((long)&signingUri.field_2 + 8);
          __end2 = std::
                   map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                   ::begin(this);
          tlv = (pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>
                 *)std::
                   map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                   ::end(this);
          while (bVar1 = std::operator!=(&__end2,(_Self *)&tlv), bVar1) {
            ppVar3 = std::
                     _Rb_tree_iterator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>
                     ::operator*(&__end2);
            bVar1 = ShouldBeSerialized(ppVar3->first,
                                       (bool)(content.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _7_1_ & 1),
                                       (bool)(content.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _6_1_ & 1));
            if (bVar1) {
              this_00 = std::
                        __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&ppVar3->second);
              commissioner::tlv::Tlv::Serialize(this_00,(ByteArray *)local_1d0);
            }
            std::
            _Rb_tree_iterator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>
            ::operator++(&__end2);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (aContent,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
        }
      }
    }
  }
  else {
    PrepareSigningContent::anon_class_1_0_00000001::operator()(&local_25a);
    local_58 = &local_258;
    local_60 = &local_259;
    bVar4 = ::fmt::v10::operator()(local_60);
    local_250 = bVar4.size_;
    local_258 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_248;
    local_78 = local_258;
    sStack_70 = local_250;
    local_50 = &local_78;
    local_88 = local_258;
    local_80 = local_250;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_248,local_88,fmt,args);
    Error::Error(&local_228,kInvalidArgs,&local_248);
    Error::operator=(__return_storage_ptr__,&local_228);
    Error::~Error(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  message.mEndpoint._7_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)((long)&signingUri.field_2 + 8));
  coap::Message::~Message((Message *)local_150);
  if ((message.mEndpoint._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::PrepareSigningContent(ByteArray &aContent, const coap::Message &aMessage)
{
    Error         error;
    coap::Message message{aMessage.GetType(), aMessage.GetCode()};
    tlv::TlvSet   tlvSet;
    std::string   signingUri;
    bool          isActiveSet  = false;
    bool          isPendingSet = false;
    ByteArray     content;

    VerifyOrExit(aMessage.GetUriPath(signingUri) == ErrorCode::kNone,
                 error = ERROR_INVALID_ARGS("the CoAP message has no valid URI Path option"));

    isActiveSet  = signingUri == uri::kMgmtActiveSet;
    isPendingSet = signingUri == uri::kMgmtPendingSet;

    if (signingUri == uri::kPetitioning)
    {
        signingUri = uri::kLeaderPetitioning;
    }
    else if (signingUri == uri::kKeepAlive)
    {
        signingUri = uri::kLeaderKeepAlive;
    }

    // Prepare serialized URI
    SuccessOrExit(error = message.SetUriPath(signingUri));
    SuccessOrExit(error = message.Serialize(content));
    content.erase(content.begin(), content.begin() + message.GetHeaderLength());

    // Sort and serialize TLVs
    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aMessage.GetPayload()));
    for (const auto &tlv : tlvSet)
    {
        if (ShouldBeSerialized(tlv.first, isActiveSet, isPendingSet))
        {
            tlv.second->Serialize(content);
        }
    }

    aContent = std::move(content);

exit:
    return error;
}